

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diskdata.c
# Opt level: O0

void dd_Save(void)

{
  _Bool _Var1;
  FILE *__stream;
  FILE *fp;
  
  _Var1 = IsDataModified();
  if ((_Var1) && (__stream = (FILE *)OpenDataFile("w"), __stream != (FILE *)0x0)) {
    fprintf(__stream,"%s %d\n",HighScoreLabel,(ulong)(uint)ActiveData.m_highScore);
    fprintf(__stream,"%s %d\n",ColorScheme1IdxLabel,(ulong)(uint)ActiveData.m_colorScheme1);
    fprintf(__stream,"%s %d\n",ColorScheme2IdxLabel,(ulong)(uint)ActiveData.m_colorScheme2);
    fclose(__stream);
    StoredData.m_colorScheme1 = ActiveData.m_colorScheme1;
    StoredData.m_highScore = ActiveData.m_highScore;
    StoredData.m_colorScheme2 = ActiveData.m_colorScheme2;
  }
  return;
}

Assistant:

void dd_Save(void)
{
  if (IsDataModified()) {
    FILE* fp = OpenDataFile("w");
    if (fp) {
      fprintf(fp, "%s %d\n", HighScoreLabel, ActiveData.m_highScore);
      fprintf(fp, "%s %d\n", ColorScheme1IdxLabel, ActiveData.m_colorScheme1);
      fprintf(fp, "%s %d\n", ColorScheme2IdxLabel, ActiveData.m_colorScheme2);
      fclose(fp);
      StoredData = ActiveData;
    }
  }
}